

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

bool flatbuffers::python::grpc::anon_unknown_0::ClientStreaming(RPCCall *method)

{
  int iVar1;
  const_iterator cVar2;
  long lVar3;
  bool bVar4;
  key_type local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"streaming","");
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                  *)&(method->super_Definition).attributes,&local_38);
  if ((_Rb_tree_header *)cVar2._M_node ==
      &(method->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
    lVar3 = 0;
  }
  else {
    lVar3 = *(long *)(cVar2._M_node + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (lVar3 == 0) {
    bVar4 = false;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)(lVar3 + 0x20));
    if (iVar1 == 0) {
      bVar4 = true;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)(lVar3 + 0x20));
      bVar4 = iVar1 == 0;
    }
  }
  return bVar4;
}

Assistant:

bool ClientStreaming(const RPCCall *method) {
  const Value *val = method->attributes.Lookup("streaming");
  return val != nullptr && (val->constant == "client" || val->constant == "bidi");
}